

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int replace_double_attr(attr_list list,atom_t attr_id,double dvalue)

{
  int iVar1;
  undefined8 in_R8;
  attr_union value;
  
  value.u.o.buffer = (void *)in_R8;
  value.u.d = dvalue;
  iVar1 = replace_pattr(list,attr_id,Attr_Float4,value);
  return iVar1;
}

Assistant:

extern int
replace_double_attr(attr_list list, atom_t attr_id, double dvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.d = dvalue;
    if (sizeof(float) == 8) t = Attr_Float8;
    if (sizeof(float) == 16) t = Attr_Float16;
    return replace_pattr(list, attr_id, t, tmp);
}